

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int iVar1;
  unsigned_short local_1e;
  uint local_1c;
  char *pcStack_18;
  uint c;
  char *utf8_chars_local;
  ImGuiIO *this_local;
  
  pcStack_18 = utf8_chars;
  utf8_chars_local = (char *)this;
  while (*pcStack_18 != '\0') {
    local_1c = 0;
    iVar1 = ImTextCharFromUtf8(&local_1c,pcStack_18,(char *)0x0);
    pcStack_18 = pcStack_18 + iVar1;
    if (local_1c != 0) {
      local_1e = (unsigned_short)local_1c;
      ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_1e);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c != 0)
            InputQueueCharacters.push_back((ImWchar)c);
    }
}